

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  
  uVar1 = cJSON_Version();
  printf("Version: %s\n",uVar1);
  create_objects();
  return 0;
}

Assistant:

main(void)
{
    /* print the version */
    printf("Version: %s\n", cJSON_Version());

    /* Now some samplecode for building objects concisely: */
    create_objects();

    return 0;
}